

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  long lVar27;
  byte bVar28;
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong unaff_R13;
  size_t mask;
  Scene *scene;
  ulong uVar35;
  byte bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar44;
  StackItemT<embree::NodeRefPtr<4>_> SVar45;
  StackItemT<embree::NodeRefPtr<4>_> SVar46;
  StackItemT<embree::NodeRefPtr<4>_> SVar47;
  StackItemT<embree::NodeRefPtr<4>_> SVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined4 uVar61;
  vint4 bi;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  vint4 ai_1;
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  vint4 ai;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar72;
  uint uVar74;
  uint uVar75;
  undefined1 auVar73 [16];
  uint uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 local_11d8 [16];
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  StackItemT<embree::NodeRefPtr<4>_> *local_11b0;
  long local_11a8;
  ulong local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_11b0 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar81 = ZEXT1664(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar82 = ZEXT1664(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar83 = ZEXT1664(auVar40);
  auVar38 = vmulss_avx512f(auVar38,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar61 = auVar38._0_4_;
  auVar41._4_4_ = uVar61;
  auVar41._0_4_ = uVar61;
  auVar41._8_4_ = uVar61;
  auVar41._12_4_ = uVar61;
  auVar38 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar61 = auVar38._0_4_;
  auVar59._4_4_ = uVar61;
  auVar59._0_4_ = uVar61;
  auVar59._8_4_ = uVar61;
  auVar59._12_4_ = uVar61;
  auVar38 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar61 = auVar38._0_4_;
  auVar40._4_4_ = uVar61;
  auVar40._0_4_ = uVar61;
  auVar40._8_4_ = uVar61;
  auVar40._12_4_ = uVar61;
  local_11b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11c0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = local_11b8 ^ 0x10;
  uVar33 = local_11c0 ^ 0x10;
  iVar26 = (tray->tfar).field_0.i[k];
  auVar63 = ZEXT1664(CONCAT412(iVar26,CONCAT48(iVar26,CONCAT44(iVar26,iVar26))));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar84 = ZEXT1664(auVar38);
  local_11a0 = uVar31 ^ 0x10;
  auVar39 = vxorps_avx512vl(auVar41,auVar38);
  auVar85 = ZEXT1664(auVar39);
  auVar39 = vxorps_avx512vl(auVar59,auVar38);
  auVar86 = ZEXT1664(auVar39);
  auVar38 = vxorps_avx512vl(auVar40,auVar38);
  auVar87 = ZEXT1664(auVar38);
  auVar38 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar88 = ZEXT1664(auVar38);
  auVar38 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar89 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar90 = ZEXT1664(auVar38);
  auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar91 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar93 = ZEXT1664(auVar38);
  do {
    do {
      do {
        if (local_11b0 == stack) {
          return;
        }
        pSVar25 = local_11b0 + -1;
        local_11b0 = local_11b0 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar25->dist);
      sVar30 = (local_11b0->ptr).ptr;
      do {
        if ((sVar30 & 8) == 0) {
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + local_11b8),auVar85._0_16_,
                               auVar81._0_16_);
          auVar39 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + local_11c0),auVar86._0_16_,
                               auVar82._0_16_);
          auVar38 = vpmaxsd_avx(auVar38,auVar39);
          auVar39 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + uVar31),auVar87._0_16_,
                               auVar83._0_16_);
          auVar39 = vpmaxsd_avx512vl(auVar39,auVar88._0_16_);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar38,auVar39);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + uVar35),auVar85._0_16_,
                               auVar81._0_16_);
          auVar39 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + uVar33),auVar86._0_16_,
                               auVar82._0_16_);
          auVar38 = vpminsd_avx(auVar38,auVar39);
          auVar39 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(sVar30 + 0x20 + local_11a0),auVar87._0_16_,
                               auVar83._0_16_);
          auVar39 = vpminsd_avx(auVar39,auVar63._0_16_);
          auVar38 = vpminsd_avx(auVar38,auVar39);
          uVar16 = vpcmpd_avx512vl((undefined1  [16])tNear.field_0,auVar38,2);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)((byte)uVar16 & 0xf));
        }
        if ((sVar30 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar26 = 4;
          }
          else {
            uVar29 = sVar30 & 0xfffffffffffffff0;
            lVar34 = 0;
            for (uVar32 = unaff_R13; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            iVar26 = 0;
            uVar32 = unaff_R13 - 1 & unaff_R13;
            sVar30 = *(ulong *)(uVar29 + lVar34 * 8);
            if (uVar32 != 0) {
              uVar72 = tNear.field_0.i[lVar34];
              lVar34 = 0;
              for (uVar37 = uVar32; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar32 = uVar32 - 1 & uVar32;
              uVar37 = *(ulong *)(uVar29 + lVar34 * 8);
              uVar74 = tNear.field_0.i[lVar34];
              if (uVar32 == 0) {
                if (uVar72 < uVar74) {
                  (local_11b0->ptr).ptr = uVar37;
                  local_11b0->dist = uVar74;
                  local_11b0 = local_11b0 + 1;
                }
                else {
                  (local_11b0->ptr).ptr = sVar30;
                  local_11b0->dist = uVar72;
                  sVar30 = uVar37;
                  local_11b0 = local_11b0 + 1;
                }
              }
              else {
                auVar38._8_8_ = 0;
                auVar38._0_8_ = sVar30;
                auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar72));
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar37;
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar74));
                lVar34 = 0;
                for (uVar37 = uVar32; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                uVar32 = uVar32 - 1 & uVar32;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = *(ulong *)(uVar29 + lVar34 * 8);
                auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416((uint)tNear.field_0.i[lVar34]));
                auVar40 = vpshufd_avx(auVar38,0xaa);
                auVar41 = vpshufd_avx(auVar39,0xaa);
                auVar59 = vpshufd_avx(auVar58,0xaa);
                if (uVar32 == 0) {
                  uVar32 = vpcmpgtd_avx512vl(auVar41,auVar40);
                  uVar32 = uVar32 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar39,auVar38);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar57._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar57._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar57._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar40._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar57._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar40._12_4_;
                  auVar39 = vmovdqa32_avx512vl(auVar39);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar42._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar42._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar42._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar42._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
                  auVar38 = vpshufd_avx(auVar57,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar59,auVar38);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar58,auVar57);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  sVar30 = CONCAT44((uint)bVar11 * auVar39._4_4_ | (uint)!bVar11 * auVar38._4_4_,
                                    (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_);
                  auVar38 = vmovdqa32_avx512vl(auVar58);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar43._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar57._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar43._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar57._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar43._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar57._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar43._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar57._12_4_;
                  auVar38 = vpshufd_avx(auVar43,0xaa);
                  auVar39 = vpshufd_avx(auVar42,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar38,auVar39);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar43,auVar42);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  SVar44.ptr.ptr._0_4_ =
                       (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  SVar44.ptr.ptr._4_4_ =
                       (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  SVar44.dist = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  SVar44._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
                  auVar38 = vmovdqa32_avx512vl(auVar43);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  SVar45.ptr.ptr._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar42._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  SVar45.ptr.ptr._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar42._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  SVar45.dist = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar42._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  SVar45._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar42._12_4_;
                  *local_11b0 = SVar45;
                  local_11b0[1] = SVar44;
                  local_11b0 = local_11b0 + 2;
                }
                else {
                  lVar34 = 0;
                  for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                    lVar34 = lVar34 + 1;
                  }
                  uVar72 = tNear.field_0.i[lVar34];
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = *(ulong *)(uVar29 + lVar34 * 8);
                  auVar51 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar72));
                  uVar32 = vpcmpgtd_avx512vl(auVar41,auVar40);
                  uVar32 = uVar32 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar39,auVar38);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar52._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar40._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar52._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar40._12_4_;
                  auVar39 = vmovdqa32_avx512vl(auVar39);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar50._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar50._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
                  auVar55._4_4_ = uVar72;
                  auVar55._0_4_ = uVar72;
                  auVar55._8_4_ = uVar72;
                  auVar55._12_4_ = uVar72;
                  uVar32 = vpcmpgtd_avx512vl(auVar55,auVar59);
                  uVar32 = uVar32 & 0xf;
                  auVar38 = vpblendmd_avx512vl(auVar51,auVar58);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar49._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * uVar72;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar49._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * uVar72;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar49._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * uVar72;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar49._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * uVar72;
                  auVar38 = vmovdqa32_avx512vl(auVar51);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar51._0_4_ = (uint)bVar10 * auVar38._0_4_ | (uint)!bVar10 * auVar58._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar51._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar58._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar51._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar58._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar51._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar58._12_4_;
                  auVar38 = vpshufd_avx(auVar51,0xaa);
                  auVar39 = vpshufd_avx(auVar50,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar38,auVar39);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar51,auVar50);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar53._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar53._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
                  auVar38 = vmovdqa32_avx512vl(auVar51);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  SVar46.ptr.ptr._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar50._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  SVar46.ptr.ptr._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar50._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  SVar46.dist = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar50._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  SVar46._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar50._12_4_;
                  auVar38 = vpshufd_avx(auVar49,0xaa);
                  auVar39 = vpshufd_avx(auVar52,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar38,auVar39);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar49,auVar52);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  sVar30 = CONCAT44((uint)bVar11 * auVar39._4_4_ | (uint)!bVar11 * auVar38._4_4_,
                                    (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_);
                  auVar38 = vmovdqa32_avx512vl(auVar49);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  auVar54._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar52._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar52._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar52._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  auVar54._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar52._12_4_;
                  auVar38 = vpshufd_avx(auVar54,0xaa);
                  auVar39 = vpshufd_avx(auVar53,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar39,auVar38);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar53,auVar54);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  SVar47.ptr.ptr._0_4_ =
                       (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  SVar47.ptr.ptr._4_4_ =
                       (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  SVar47.dist = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  SVar47._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
                  auVar38 = vmovdqa32_avx512vl(auVar53);
                  bVar10 = (bool)((byte)uVar32 & 1);
                  SVar48.ptr.ptr._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar54._0_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                  SVar48.ptr.ptr._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar54._4_4_;
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  SVar48.dist = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar54._8_4_;
                  bVar10 = SUB81(uVar32 >> 3,0);
                  SVar48._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar54._12_4_;
                  *local_11b0 = SVar46;
                  local_11b0[1] = SVar48;
                  local_11b0[2] = SVar47;
                  local_11b0 = local_11b0 + 3;
                }
              }
            }
          }
        }
        else {
          iVar26 = 6;
        }
      } while (iVar26 == 0);
    } while (iVar26 != 6);
    local_11a8 = (ulong)((uint)sVar30 & 0xf) - 8;
    if (local_11a8 != 0) {
      uVar32 = sVar30 & 0xfffffffffffffff0;
      lVar34 = 0;
      do {
        lVar27 = lVar34 * 0x50;
        pSVar2 = context->scene;
        ppfVar3 = (pSVar2->vertices).items;
        pfVar4 = ppfVar3[*(uint *)(uVar32 + 0x30 + lVar27)];
        pfVar5 = ppfVar3[*(uint *)(uVar32 + 0x34 + lVar27)];
        pfVar6 = ppfVar3[*(uint *)(uVar32 + 0x38 + lVar27)];
        pfVar7 = ppfVar3[*(uint *)(uVar32 + 0x3c + lVar27)];
        auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 8 + lVar27)));
        auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 8 + lVar27)));
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 4 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0xc + lVar27)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 4 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0xc + lVar27)));
        auVar52 = vunpcklps_avx(auVar38,auVar39);
        auVar50 = vunpcklps_avx(auVar40,auVar41);
        auVar51 = vunpckhps_avx(auVar40,auVar41);
        auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + 0x10 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 0x18 + lVar27)));
        auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + 0x10 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 0x18 + lVar27)));
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 0x14 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x1c + lVar27)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 0x14 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x1c + lVar27)));
        auVar58 = vunpcklps_avx(auVar38,auVar39);
        auVar49 = vunpcklps_avx(auVar40,auVar41);
        auVar39 = vunpckhps_avx(auVar40,auVar41);
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + 0x20 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 0x28 + lVar27)));
        auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar32 + 0x20 + lVar27)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar32 + 0x28 + lVar27)));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 0x24 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x2c + lVar27)));
        auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar32 + 0x24 + lVar27)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar32 + 0x2c + lVar27)));
        auVar53 = vunpcklps_avx(auVar38,auVar40);
        auVar54 = vunpcklps_avx(auVar41,auVar59);
        puVar1 = (undefined8 *)(uVar32 + 0x30 + lVar27);
        local_1018 = *puVar1;
        uStack_1010 = puVar1[1];
        auVar59 = vunpckhps_avx(auVar41,auVar59);
        puVar1 = (undefined8 *)(uVar32 + 0x40 + lVar27);
        local_1168 = *puVar1;
        uStack_1160 = puVar1[1];
        auVar38 = vsubps_avx(auVar50,auVar49);
        auVar39 = vsubps_avx(auVar51,auVar39);
        auVar40 = vsubps_avx(auVar52,auVar58);
        auVar41 = vsubps_avx(auVar54,auVar50);
        auVar59 = vsubps_avx(auVar59,auVar51);
        auVar58 = vsubps_avx(auVar53,auVar52);
        auVar62._0_4_ = auVar39._0_4_ * auVar58._0_4_;
        auVar62._4_4_ = auVar39._4_4_ * auVar58._4_4_;
        auVar62._8_4_ = auVar39._8_4_ * auVar58._8_4_;
        auVar62._12_4_ = auVar39._12_4_ * auVar58._12_4_;
        local_10d8 = vfmsub231ps_fma(auVar62,auVar59,auVar40);
        auVar64._0_4_ = auVar40._0_4_ * auVar41._0_4_;
        auVar64._4_4_ = auVar40._4_4_ * auVar41._4_4_;
        auVar64._8_4_ = auVar40._8_4_ * auVar41._8_4_;
        auVar64._12_4_ = auVar40._12_4_ * auVar41._12_4_;
        local_10c8 = vfmsub231ps_fma(auVar64,auVar58,auVar38);
        auVar65._0_4_ = auVar38._0_4_ * auVar59._0_4_;
        auVar65._4_4_ = auVar38._4_4_ * auVar59._4_4_;
        auVar65._8_4_ = auVar38._8_4_ * auVar59._8_4_;
        auVar65._12_4_ = auVar38._12_4_ * auVar59._12_4_;
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar73._4_4_ = uVar61;
        auVar73._0_4_ = uVar61;
        auVar73._8_4_ = uVar61;
        auVar73._12_4_ = uVar61;
        fVar66 = *(float *)(ray + k * 4 + 0x50);
        auVar80._4_4_ = fVar66;
        auVar80._0_4_ = fVar66;
        auVar80._8_4_ = fVar66;
        auVar80._12_4_ = fVar66;
        auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar61 = *(undefined4 *)(ray + k * 4);
        auVar17._4_4_ = uVar61;
        auVar17._0_4_ = uVar61;
        auVar17._8_4_ = uVar61;
        auVar17._12_4_ = uVar61;
        auVar50 = vsubps_avx512vl(auVar50,auVar17);
        local_10b8 = vfmsub231ps_fma(auVar65,auVar41,auVar39);
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar18._4_4_ = uVar61;
        auVar18._0_4_ = uVar61;
        auVar18._8_4_ = uVar61;
        auVar18._12_4_ = uVar61;
        auVar51 = vsubps_avx512vl(auVar51,auVar18);
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar19._4_4_ = uVar61;
        auVar19._0_4_ = uVar61;
        auVar19._8_4_ = uVar61;
        auVar19._12_4_ = uVar61;
        auVar52 = vsubps_avx512vl(auVar52,auVar19);
        auVar77._0_4_ = fVar66 * auVar52._0_4_;
        auVar77._4_4_ = fVar66 * auVar52._4_4_;
        auVar77._8_4_ = fVar66 * auVar52._8_4_;
        auVar77._12_4_ = fVar66 * auVar52._12_4_;
        auVar53 = vfmsub231ps_avx512vl(auVar77,auVar51,auVar49);
        auVar54 = vmulps_avx512vl(auVar49,auVar50);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar52,auVar73);
        auVar55 = vmulps_avx512vl(auVar73,auVar51);
        auVar55 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar80);
        auVar49 = vmulps_avx512vl(local_10b8,auVar49);
        auVar49 = vfmadd231ps_avx512vl(auVar49,local_10c8,auVar80);
        auVar49 = vfmadd231ps_avx512vl(auVar49,local_10d8,auVar73);
        auVar56 = vandps_avx512vl(auVar49,auVar90._0_16_);
        auVar57 = vandps_avx512vl(auVar49,auVar84._0_16_);
        auVar58 = vmulps_avx512vl(auVar58,auVar55);
        auVar59 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar59);
        auVar41 = vfmadd231ps_fma(auVar59,auVar53,auVar41);
        uVar72 = auVar57._0_4_;
        tNear.field_0._0_4_ = (float)(uVar72 ^ auVar41._0_4_);
        uVar74 = auVar57._4_4_;
        tNear.field_0._4_4_ = (float)(uVar74 ^ auVar41._4_4_);
        uVar75 = auVar57._8_4_;
        tNear.field_0._8_4_ = (float)(uVar75 ^ auVar41._8_4_);
        uVar76 = auVar57._12_4_;
        tNear.field_0._12_4_ = (float)(uVar76 ^ auVar41._12_4_);
        auVar40 = vmulps_avx512vl(auVar40,auVar55);
        auVar39 = vfmadd231ps_avx512vl(auVar40,auVar39,auVar54);
        auVar38 = vfmadd231ps_fma(auVar39,auVar38,auVar53);
        auVar78._0_4_ = (float)(uVar72 ^ auVar38._0_4_);
        auVar78._4_4_ = (float)(uVar74 ^ auVar38._4_4_);
        auVar78._8_4_ = (float)(uVar75 ^ auVar38._8_4_);
        auVar78._12_4_ = (float)(uVar76 ^ auVar38._12_4_);
        auVar38 = auVar91._0_16_;
        uVar16 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar38,5);
        uVar13 = vcmpps_avx512vl(auVar78,auVar38,5);
        uVar14 = vcmpps_avx512vl(auVar49,auVar38,4);
        auVar79._0_4_ = auVar78._0_4_ + tNear.field_0._0_4_;
        auVar79._4_4_ = auVar78._4_4_ + tNear.field_0._4_4_;
        auVar79._8_4_ = auVar78._8_4_ + tNear.field_0._8_4_;
        auVar79._12_4_ = auVar78._12_4_ + tNear.field_0._12_4_;
        uVar15 = vcmpps_avx512vl(auVar79,auVar56,2);
        bVar36 = (byte)uVar16 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
        if (bVar36 != 0) {
          auVar71._0_4_ = local_10b8._0_4_ * auVar52._0_4_;
          auVar71._4_4_ = local_10b8._4_4_ * auVar52._4_4_;
          auVar71._8_4_ = local_10b8._8_4_ * auVar52._8_4_;
          auVar71._12_4_ = local_10b8._12_4_ * auVar52._12_4_;
          auVar38 = vfmadd213ps_fma(auVar51,local_10c8,auVar71);
          auVar38 = vfmadd213ps_fma(auVar50,local_10d8,auVar38);
          auVar70._0_4_ = (float)(uVar72 ^ auVar38._0_4_);
          auVar70._4_4_ = (float)(uVar74 ^ auVar38._4_4_);
          auVar70._8_4_ = (float)(uVar75 ^ auVar38._8_4_);
          auVar70._12_4_ = (float)(uVar76 ^ auVar38._12_4_);
          uVar61 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar20._4_4_ = uVar61;
          auVar20._0_4_ = uVar61;
          auVar20._8_4_ = uVar61;
          auVar20._12_4_ = uVar61;
          auVar38 = vmulps_avx512vl(auVar56,auVar20);
          uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar21._4_4_ = uVar61;
          auVar21._0_4_ = uVar61;
          auVar21._8_4_ = uVar61;
          auVar21._12_4_ = uVar61;
          auVar39 = vmulps_avx512vl(auVar56,auVar21);
          uVar16 = vcmpps_avx512vl(auVar70,auVar39,2);
          uVar13 = vcmpps_avx512vl(auVar38,auVar70,1);
          bVar36 = (byte)uVar16 & (byte)uVar13 & bVar36;
          uVar29 = (ulong)bVar36;
          if (bVar36 != 0) {
            auVar38 = vrcp14ps_avx512vl(auVar56);
            auVar39 = vfnmadd213ps_avx512vl(auVar56,auVar38,auVar92._0_16_);
            auVar38 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
            fVar66 = auVar38._0_4_;
            local_10e8._0_4_ = fVar66 * auVar70._0_4_;
            fVar67 = auVar38._4_4_;
            local_10e8._4_4_ = fVar67 * auVar70._4_4_;
            fVar68 = auVar38._8_4_;
            local_10e8._8_4_ = fVar68 * auVar70._8_4_;
            fVar69 = auVar38._12_4_;
            local_10e8._12_4_ = fVar69 * auVar70._12_4_;
            auVar63 = ZEXT1664(local_10e8);
            local_1108[0] = fVar66 * tNear.field_0._0_4_;
            local_1108[1] = fVar67 * tNear.field_0._4_4_;
            local_1108[2] = fVar68 * tNear.field_0._8_4_;
            local_1108[3] = fVar69 * tNear.field_0._12_4_;
            local_10f8[0] = fVar66 * auVar78._0_4_;
            local_10f8[1] = fVar67 * auVar78._4_4_;
            local_10f8[2] = fVar68 * auVar78._8_4_;
            local_10f8[3] = fVar69 * auVar78._12_4_;
            auVar38 = vblendmps_avx512vl(auVar93._0_16_,local_10e8);
            auVar60._0_4_ =
                 (uint)(bVar36 & 1) * auVar38._0_4_ |
                 (uint)!(bool)(bVar36 & 1) * (int)(fVar66 * auVar78._0_4_);
            bVar10 = (bool)(bVar36 >> 1 & 1);
            auVar60._4_4_ =
                 (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * (int)(fVar67 * auVar78._4_4_);
            bVar10 = (bool)(bVar36 >> 2 & 1);
            auVar60._8_4_ =
                 (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * (int)(fVar68 * auVar78._8_4_);
            bVar10 = (bool)(bVar36 >> 3 & 1);
            auVar60._12_4_ =
                 (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * (int)(fVar69 * auVar78._12_4_);
            auVar38 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar38 = vminps_avx(auVar38,auVar60);
            auVar39 = vshufpd_avx(auVar38,auVar38,1);
            auVar38 = vminps_avx(auVar39,auVar38);
            uVar16 = vcmpps_avx512vl(auVar60,auVar38,0);
            bVar28 = (byte)uVar16 & bVar36;
            if (((byte)uVar16 & bVar36) == 0) {
              bVar28 = bVar36;
            }
            local_11c8 = 0;
            for (uVar37 = (ulong)bVar28; (uVar37 & 1) == 0;
                uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              local_11c8 = local_11c8 + 1;
            }
            do {
              auVar39 = auVar91._0_16_;
              uVar72 = *(uint *)((long)&local_1018 + local_11c8 * 4);
              pGVar8 = (pSVar2->geometries).items[uVar72].ptr;
              auVar38 = auVar60;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar29 = (ulong)(byte)(~(byte)(1 << ((uint)local_11c8 & 0x1f)) & (byte)uVar29);
                bVar10 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar10 = false;
              }
              else {
                local_10a8 = auVar63._0_16_;
                local_1088 = vmovdqa64_avx512vl(auVar88._0_16_);
                local_1078 = auVar87._0_16_;
                local_1068 = auVar86._0_16_;
                local_1058 = auVar85._0_16_;
                local_1048 = auVar83._0_16_;
                local_1038 = auVar82._0_16_;
                local_1028 = auVar81._0_16_;
                fVar66 = local_1108[local_11c8];
                h.u.field_0.i[1] = (int)fVar66;
                h.u.field_0.i[0] = (int)fVar66;
                h.u.field_0.i[2] = (int)fVar66;
                h.u.field_0.i[3] = (int)fVar66;
                h.v.field_0.v[0] = local_10f8[local_11c8];
                h.geomID.field_0 =
                     (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                uVar61 = *(undefined4 *)((long)&local_1168 + local_11c8 * 4);
                h.primID.field_0.i[1] = uVar61;
                h.primID.field_0.i[0] = uVar61;
                h.primID.field_0.i[2] = uVar61;
                h.primID.field_0.i[3] = uVar61;
                h.Ng.field_0._0_4_ = *(undefined4 *)(local_10d8 + local_11c8 * 4);
                uVar61 = *(undefined4 *)(local_10c8 + local_11c8 * 4);
                h.Ng.field_0._20_4_ = uVar61;
                h.Ng.field_0._16_4_ = uVar61;
                h.Ng.field_0._24_4_ = uVar61;
                h.Ng.field_0._28_4_ = uVar61;
                uVar61 = *(undefined4 *)(local_10b8 + local_11c8 * 4);
                h.Ng.field_0._36_4_ = uVar61;
                h.Ng.field_0._32_4_ = uVar61;
                h.Ng.field_0._40_4_ = uVar61;
                h.Ng.field_0._44_4_ = uVar61;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                              ZEXT1632((undefined1  [16])h.u.field_0));
                h.instID[0].field_0.i[1] = context->user->instID[0];
                h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                uVar74 = *(uint *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + local_11c8 * 4);
                local_1098 = vmovdqa64_avx512vl(auVar89._0_16_);
                local_11d8 = vmovdqa64_avx512vl(auVar89._0_16_);
                args.valid = (int *)local_11d8;
                args.geometryUserPtr = pGVar8->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->intersectionFilterN)(&args);
                }
                uVar37 = vptestmd_avx512vl(local_11d8,local_11d8);
                if ((uVar37 & 0xf) == 0) {
LAB_0075a68c:
                  auVar38 = ZEXT416(uVar74);
                  *(uint *)(ray + k * 4 + 0x80) = uVar74;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&args);
                  }
                  uVar37 = vptestmd_avx512vl(local_11d8,local_11d8);
                  uVar37 = uVar37 & 0xf;
                  bVar36 = (byte)uVar37;
                  if (bVar36 == 0) goto LAB_0075a68c;
                  iVar26 = *(int *)(args.hit + 4);
                  iVar23 = *(int *)(args.hit + 8);
                  iVar24 = *(int *)(args.hit + 0xc);
                  bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar12 = SUB81(uVar37 >> 3,0);
                  *(uint *)(args.ray + 0xc0) =
                       (uint)(bVar36 & 1) * *(int *)args.hit |
                       (uint)!(bool)(bVar36 & 1) * *(uint *)(args.ray + 0xc0);
                  *(uint *)(args.ray + 0xc4) =
                       (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(args.ray + 0xc4);
                  *(uint *)(args.ray + 200) =
                       (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 200);
                  *(uint *)(args.ray + 0xcc) =
                       (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(args.ray + 0xcc);
                  iVar26 = *(int *)(args.hit + 0x14);
                  iVar23 = *(int *)(args.hit + 0x18);
                  iVar24 = *(int *)(args.hit + 0x1c);
                  bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar12 = SUB81(uVar37 >> 3,0);
                  *(uint *)(args.ray + 0xd0) =
                       (uint)(bVar36 & 1) * *(int *)(args.hit + 0x10) |
                       (uint)!(bool)(bVar36 & 1) * *(uint *)(args.ray + 0xd0);
                  *(uint *)(args.ray + 0xd4) =
                       (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(args.ray + 0xd4);
                  *(uint *)(args.ray + 0xd8) =
                       (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xd8);
                  *(uint *)(args.ray + 0xdc) =
                       (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(args.ray + 0xdc);
                  iVar26 = *(int *)(args.hit + 0x24);
                  iVar23 = *(int *)(args.hit + 0x28);
                  iVar24 = *(int *)(args.hit + 0x2c);
                  bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar12 = SUB81(uVar37 >> 3,0);
                  *(uint *)(args.ray + 0xe0) =
                       (uint)(bVar36 & 1) * *(int *)(args.hit + 0x20) |
                       (uint)!(bool)(bVar36 & 1) * *(uint *)(args.ray + 0xe0);
                  *(uint *)(args.ray + 0xe4) =
                       (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(args.ray + 0xe4);
                  *(uint *)(args.ray + 0xe8) =
                       (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xe8);
                  *(uint *)(args.ray + 0xec) =
                       (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(args.ray + 0xec);
                  iVar26 = *(int *)(args.hit + 0x34);
                  iVar23 = *(int *)(args.hit + 0x38);
                  iVar24 = *(int *)(args.hit + 0x3c);
                  bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar12 = SUB81(uVar37 >> 3,0);
                  *(uint *)(args.ray + 0xf0) =
                       (uint)(bVar36 & 1) * *(int *)(args.hit + 0x30) |
                       (uint)!(bool)(bVar36 & 1) * *(uint *)(args.ray + 0xf0);
                  *(uint *)(args.ray + 0xf4) =
                       (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(args.ray + 0xf4);
                  *(uint *)(args.ray + 0xf8) =
                       (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0xf8);
                  *(uint *)(args.ray + 0xfc) =
                       (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(args.ray + 0xfc);
                  iVar26 = *(int *)(args.hit + 0x44);
                  iVar23 = *(int *)(args.hit + 0x48);
                  iVar24 = *(int *)(args.hit + 0x4c);
                  bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                  bVar12 = SUB81(uVar37 >> 3,0);
                  *(uint *)(args.ray + 0x100) =
                       (uint)(bVar36 & 1) * *(int *)(args.hit + 0x40) |
                       (uint)!(bool)(bVar36 & 1) * *(uint *)(args.ray + 0x100);
                  *(uint *)(args.ray + 0x104) =
                       (uint)bVar10 * iVar26 | (uint)!bVar10 * *(int *)(args.ray + 0x104);
                  *(uint *)(args.ray + 0x108) =
                       (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(args.ray + 0x108);
                  *(uint *)(args.ray + 0x10c) =
                       (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(args.ray + 0x10c);
                  auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar38;
                  auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar38;
                  auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar38;
                  auVar38 = *(undefined1 (*) [16])(args.hit + 0x80);
                  auVar40 = vmovdqa32_avx512vl(auVar38);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar40;
                }
                auVar63 = ZEXT1664(local_10a8);
                uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar22._4_4_ = uVar61;
                auVar22._0_4_ = uVar61;
                auVar22._8_4_ = uVar61;
                auVar22._12_4_ = uVar61;
                uVar16 = vcmpps_avx512vl(local_10a8,auVar22,2);
                uVar29 = (ulong)(byte)(~(byte)(1 << ((uint)local_11c8 & 0x1f)) & (byte)uVar29 &
                                      (byte)uVar16);
                bVar10 = true;
                auVar81 = ZEXT1664(local_1028);
                auVar82 = ZEXT1664(local_1038);
                auVar83 = ZEXT1664(local_1048);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar84 = ZEXT1664(auVar40);
                auVar85 = ZEXT1664(local_1058);
                auVar86 = ZEXT1664(local_1068);
                auVar87 = ZEXT1664(local_1078);
                auVar40 = vmovdqa64_avx512vl(local_1088);
                auVar88 = ZEXT1664(auVar40);
                auVar40 = vmovdqa64_avx512vl(local_1098);
                auVar89 = ZEXT1664(auVar40);
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar90 = ZEXT1664(auVar40);
                auVar39 = vxorps_avx512vl(auVar39,auVar39);
                auVar91 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar92 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar93 = ZEXT1664(auVar39);
              }
              if (!bVar10) {
                fVar66 = local_1108[local_11c8];
                fVar67 = local_10f8[local_11c8];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + local_11c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10d8 + local_11c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10c8 + local_11c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10b8 + local_11c8 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar66;
                *(float *)(ray + k * 4 + 0x100) = fVar67;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1168 + local_11c8 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar72;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar36 = (byte)uVar29;
              if (bVar36 == 0) break;
              auVar39 = vblendmps_avx512vl(auVar93._0_16_,auVar63._0_16_);
              auVar60._0_4_ =
                   (uint)(bVar36 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar38._0_4_;
              bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
              auVar60._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
              bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
              auVar60._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
              bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
              auVar60._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
              auVar38 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar38 = vminps_avx(auVar38,auVar60);
              auVar39 = vshufpd_avx(auVar38,auVar38,1);
              auVar38 = vminps_avx(auVar39,auVar38);
              uVar16 = vcmpps_avx512vl(auVar60,auVar38,0);
              bVar36 = (byte)uVar16 & bVar36;
              uVar72 = (uint)uVar29;
              if (bVar36 != 0) {
                uVar72 = (uint)bVar36;
              }
              uVar74 = 0;
              for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                uVar74 = uVar74 + 1;
              }
              local_11c8 = (ulong)uVar74;
            } while( true );
          }
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != local_11a8);
    }
    uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar63 = ZEXT1664(CONCAT412(uVar61,CONCAT48(uVar61,CONCAT44(uVar61,uVar61))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }